

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Reference *v)

{
  AssetPath *pAVar1;
  bool bVar2;
  allocator local_1e1;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  AssetPath *local_18;
  Reference *v_local;
  
  local_18 = (AssetPath *)this;
  v_local = (Reference *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::operator<<(aoStack_190,local_18);
  bVar2 = Path::is_valid((Path *)(local_18 + 1));
  if (bVar2) {
    ::std::operator<<(aoStack_190,(Path *)(local_18 + 1));
  }
  ::std::operator<<(aoStack_190,(LayerOffset *)&local_18[4].asset_path_.field_2);
  bVar2 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)&local_18[4].resolved_path_);
  if (!bVar2) {
    pAVar1 = local_18 + 4;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1e0,"customData",&local_1e1);
    print_customData(&local_1c0,(CustomDataType *)&pAVar1->resolved_path_,&local_1e0,0);
    ::std::operator<<(aoStack_190,(string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Reference &v) {
  std::stringstream ss;

  ss << v.asset_path;
  if (v.prim_path.is_valid()) {
    ss << v.prim_path;
  }

  ss << v.layerOffset;

  if (!v.customData.empty()) {
    // TODO: Indent
    ss << print_customData(v.customData, "customData", /* indent */ 0);
  }

  return ss.str();
}